

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int flags,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  long lVar4;
  mbedtls_mpi_sint mStack_80;
  uint local_74;
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  
  if (nbits - 0x2001 < 0xffffffffffffe002) {
    return -4;
  }
  Y.s = 1;
  Y.n = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  lVar4 = ((nbits >> 6) + 1) - (ulong)((nbits & 0x3f) == 0);
  local_74 = 4;
  if ((flags & 2U) == 0) {
    if (0x513 < nbits) {
      local_74 = 2;
      goto LAB_00120f27;
    }
    if (0x351 < nbits) {
      local_74 = 3;
      goto LAB_00120f27;
    }
    local_74 = 4;
    if (0x289 < nbits) goto LAB_00120f27;
    if (nbits < 0x15e) {
      if (nbits < 0xfa) {
        local_74 = (uint)(nbits < 0x96) * 9 + 0x12;
      }
      else {
        local_74 = 0xc;
      }
      goto LAB_00120f27;
    }
  }
  else {
    if (0x5a9 < nbits) goto LAB_00120f27;
    if (0x47d < nbits) {
      local_74 = 5;
      goto LAB_00120f27;
    }
    if (999 < nbits) {
      local_74 = 6;
      goto LAB_00120f27;
    }
    if (0x351 < nbits) {
      local_74 = 7;
      goto LAB_00120f27;
    }
    if (nbits < 0x2ee) {
      if (nbits < 500) {
        if (nbits < 0xfa) {
          local_74 = 0x33;
          if (0x95 < nbits) {
            local_74 = 0x28;
          }
        }
        else {
          local_74 = 0x1c;
        }
      }
      else {
        local_74 = 0xd;
      }
      goto LAB_00120f27;
    }
  }
  local_74 = 8;
LAB_00120f27:
  while (iVar2 = mbedtls_mpi_fill_random(X,lVar4 * 8,f_rng,p_rng), iVar2 == 0) {
    puVar3 = X->p;
    if (0xb504f333f9de6484 < puVar3[lVar4 + -1]) {
      if (nbits < (ulong)(lVar4 * 0x40)) {
        iVar2 = mbedtls_mpi_shift_r(X,lVar4 * 0x40 - nbits);
        if (iVar2 != 0) break;
        puVar3 = X->p;
      }
      uVar1 = *puVar3;
      *puVar3 = uVar1 | 1;
      if ((flags & 1U) != 0) {
        *puVar3 = uVar1 | 3;
        iVar2 = mbedtls_mpi_mod_int(&r,X,3);
        if (iVar2 != 0) break;
        if (r == 1) {
          mStack_80 = 4;
LAB_00121019:
          iVar2 = mbedtls_mpi_add_int(X,X,mStack_80);
          if (iVar2 != 0) break;
        }
        else if (r == 0) {
          mStack_80 = 8;
          goto LAB_00121019;
        }
        iVar2 = mbedtls_mpi_copy(&Y,X);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_shift_r(&Y,1), iVar2 == 0)) {
          do {
            iVar2 = mpi_check_small_factors(X);
            if (((iVar2 == 0) && (iVar2 = mpi_check_small_factors(&Y), iVar2 == 0)) &&
               (iVar2 = mpi_miller_rabin(X,(ulong)local_74,f_rng,p_rng), iVar2 == 0)) {
              iVar2 = mpi_miller_rabin(&Y,(ulong)local_74,f_rng,p_rng);
            }
          } while (((iVar2 == -0xe) && (iVar2 = mbedtls_mpi_add_int(X,X,0xc), iVar2 == 0)) &&
                  (iVar2 = mbedtls_mpi_add_int(&Y,&Y,6), iVar2 == 0));
        }
        break;
      }
      iVar2 = mbedtls_mpi_is_prime_ext(X,local_74,f_rng,p_rng);
      if (iVar2 != -0xe) break;
    }
  }
  mbedtls_mpi_free(&Y);
  return iVar2;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int flags,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
#ifdef MBEDTLS_HAVE_INT64
// ceil(2^63.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f333f9de6485ULL
#else
// ceil(2^31.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f334U
#endif
    int ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
    size_t k, n;
    int rounds;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_LOW_ERR ) == 0 )
    {
        /*
         * 2^-80 error probability, number of rounds chosen per HAC, table 4.4
         */
        rounds = ( ( nbits >= 1300 ) ?  2 : ( nbits >=  850 ) ?  3 :
                   ( nbits >=  650 ) ?  4 : ( nbits >=  350 ) ?  8 :
                   ( nbits >=  250 ) ? 12 : ( nbits >=  150 ) ? 18 : 27 );
    }
    else
    {
        /*
         * 2^-100 error probability, number of rounds computed based on HAC,
         * fact 4.48
         */
        rounds = ( ( nbits >= 1450 ) ?  4 : ( nbits >=  1150 ) ?  5 :
                   ( nbits >= 1000 ) ?  6 : ( nbits >=   850 ) ?  7 :
                   ( nbits >=  750 ) ?  8 : ( nbits >=   500 ) ? 13 :
                   ( nbits >=  250 ) ? 28 : ( nbits >=   150 ) ? 40 : 51 );
    }

    while( 1 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );
        /* make sure generated number is at least (nbits-1)+0.5 bits (FIPS 186-4 §B.3.3 steps 4.4, 5.5) */
        if( X->p[n-1] < CEIL_MAXUINT_DIV_SQRT2 ) continue;

        k = n * biL;
        if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits ) );
        X->p[0] |= 1;

        if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_DH ) == 0 )
        {
            ret = mbedtls_mpi_is_prime_ext( X, rounds, f_rng, p_rng );

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;
        }
        else
        {
            /*
             * An necessary condition for Y and X = 2Y + 1 to be prime
             * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
             * Make sure it is satisfied, while keeping X = 3 mod 4
             */

            X->p[0] |= 2;

            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
            if( r == 0 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
            else if( r == 1 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

            /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

            while( 1 )
            {
                /*
                 * First, check small factors for X and Y
                 * before doing Miller-Rabin on any of them
                 */
                if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                    ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                    ( ret = mpi_miller_rabin(  X, rounds, f_rng, p_rng  ) )
                                                                    == 0 &&
                    ( ret = mpi_miller_rabin( &Y, rounds, f_rng, p_rng  ) )
                                                                    == 0 )
                    goto cleanup;

                if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                    goto cleanup;

                /*
                 * Next candidates. We want to preserve Y = (X-1) / 2 and
                 * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
                 * so up Y by 6 and X by 12.
                 */
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}